

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDiscreteDynamicsWorld.cpp
# Opt level: O3

void __thiscall
InplaceSolverIslandCallback::processIsland
          (InplaceSolverIslandCallback *this,btCollisionObject **bodies,int numBodies,
          btPersistentManifold **manifolds,int numManifolds,int islandId)

{
  int iVar1;
  btCollisionObject **ptr;
  btPersistentManifold **ptr_00;
  btTypedConstraint **ptr_01;
  uint uVar2;
  btCollisionObject **ppbVar3;
  btPersistentManifold **ppbVar4;
  btTypedConstraint **ppbVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  _func_int **pp_Var11;
  int iVar12;
  btTypedConstraint **ppbVar13;
  
  if (islandId < 0) {
    pp_Var11 = this->m_solver->_vptr_btConstraintSolver;
  }
  else {
    iVar1 = this->m_numConstraints;
    uVar8 = 0;
    if ((long)iVar1 < 1) {
      uVar10 = 0;
      ppbVar13 = (btTypedConstraint **)0x0;
LAB_001abba0:
      if ((int)uVar10 < iVar1) {
        uVar10 = uVar10 & 0xffffffff;
        uVar8 = 0;
        do {
          iVar12 = (this->m_sortedConstraints[uVar10]->m_rbA->super_btCollisionObject).m_islandTag1;
          if (iVar12 < 0) {
            iVar12 = (this->m_sortedConstraints[uVar10]->m_rbB->super_btCollisionObject).
                     m_islandTag1;
          }
          uVar8 = uVar8 + (iVar12 == islandId);
          uVar10 = uVar10 + 1;
        } while ((int)uVar10 < iVar1);
      }
    }
    else {
      ppbVar13 = this->m_sortedConstraints;
      uVar10 = 0;
      do {
        iVar12 = ((*ppbVar13)->m_rbA->super_btCollisionObject).m_islandTag1;
        if (iVar12 < 0) {
          iVar12 = ((*ppbVar13)->m_rbB->super_btCollisionObject).m_islandTag1;
        }
        if (iVar12 == islandId) goto LAB_001abba0;
        uVar10 = uVar10 + 1;
        ppbVar13 = ppbVar13 + 1;
      } while ((long)iVar1 != uVar10);
      ppbVar13 = (btTypedConstraint **)0x0;
      uVar8 = 0;
    }
    if (1 < (this->m_solverInfo->super_btContactSolverInfoData).m_minimumSolverBatchSize) {
      if (0 < numBodies) {
        uVar6 = (this->m_bodies).m_size;
        uVar2 = (this->m_bodies).m_capacity;
        uVar10 = 0;
        do {
          if (uVar6 == uVar2) {
            uVar9 = uVar2 * 2;
            if (uVar2 == 0) {
              uVar9 = 1;
            }
            uVar6 = uVar2;
            if ((int)uVar2 < (int)uVar9) {
              if (uVar9 == 0) {
                ppbVar3 = (btCollisionObject **)0x0;
              }
              else {
                ppbVar3 = (btCollisionObject **)btAlignedAllocInternal((long)(int)uVar9 << 3,0x10);
                uVar2 = (this->m_bodies).m_size;
              }
              if (0 < (int)uVar2) {
                uVar7 = 0;
                do {
                  ppbVar3[uVar7] = (this->m_bodies).m_data[uVar7];
                  uVar7 = uVar7 + 1;
                } while (uVar2 != uVar7);
              }
              ptr = (this->m_bodies).m_data;
              if ((ptr != (btCollisionObject **)0x0) && ((this->m_bodies).m_ownsMemory == true)) {
                btAlignedFreeInternal(ptr);
                uVar2 = (this->m_bodies).m_size;
              }
              (this->m_bodies).m_ownsMemory = true;
              (this->m_bodies).m_data = ppbVar3;
              (this->m_bodies).m_capacity = uVar9;
              uVar6 = uVar2;
              uVar2 = uVar9;
            }
          }
          (this->m_bodies).m_data[(int)uVar6] = bodies[uVar10];
          uVar6 = uVar6 + 1;
          (this->m_bodies).m_size = uVar6;
          uVar10 = uVar10 + 1;
        } while (uVar10 != (uint)numBodies);
      }
      if (0 < numManifolds) {
        uVar6 = (this->m_manifolds).m_size;
        uVar2 = (this->m_manifolds).m_capacity;
        uVar10 = 0;
        do {
          if (uVar6 == uVar2) {
            uVar9 = uVar2 * 2;
            if (uVar2 == 0) {
              uVar9 = 1;
            }
            uVar6 = uVar2;
            if ((int)uVar2 < (int)uVar9) {
              if (uVar9 == 0) {
                ppbVar4 = (btPersistentManifold **)0x0;
              }
              else {
                ppbVar4 = (btPersistentManifold **)
                          btAlignedAllocInternal((long)(int)uVar9 << 3,0x10);
                uVar2 = (this->m_manifolds).m_size;
              }
              if (0 < (int)uVar2) {
                uVar7 = 0;
                do {
                  ppbVar4[uVar7] = (this->m_manifolds).m_data[uVar7];
                  uVar7 = uVar7 + 1;
                } while (uVar2 != uVar7);
              }
              ptr_00 = (this->m_manifolds).m_data;
              if ((ptr_00 != (btPersistentManifold **)0x0) &&
                 ((this->m_manifolds).m_ownsMemory == true)) {
                btAlignedFreeInternal(ptr_00);
                uVar2 = (this->m_manifolds).m_size;
              }
              (this->m_manifolds).m_ownsMemory = true;
              (this->m_manifolds).m_data = ppbVar4;
              (this->m_manifolds).m_capacity = uVar9;
              uVar6 = uVar2;
              uVar2 = uVar9;
            }
          }
          (this->m_manifolds).m_data[(int)uVar6] = manifolds[uVar10];
          uVar6 = uVar6 + 1;
          (this->m_manifolds).m_size = uVar6;
          uVar10 = uVar10 + 1;
        } while (uVar10 != (uint)numManifolds);
      }
      if ((int)uVar8 < 1) {
        uVar6 = (this->m_constraints).m_size;
      }
      else {
        uVar6 = (this->m_constraints).m_size;
        uVar2 = (this->m_constraints).m_capacity;
        uVar10 = 0;
        do {
          if (uVar6 == uVar2) {
            uVar9 = uVar2 * 2;
            if (uVar2 == 0) {
              uVar9 = 1;
            }
            uVar6 = uVar2;
            if ((int)uVar2 < (int)uVar9) {
              if (uVar9 == 0) {
                ppbVar5 = (btTypedConstraint **)0x0;
              }
              else {
                ppbVar5 = (btTypedConstraint **)btAlignedAllocInternal((long)(int)uVar9 << 3,0x10);
                uVar2 = (this->m_constraints).m_size;
              }
              if (0 < (int)uVar2) {
                uVar7 = 0;
                do {
                  ppbVar5[uVar7] = (this->m_constraints).m_data[uVar7];
                  uVar7 = uVar7 + 1;
                } while (uVar2 != uVar7);
              }
              ptr_01 = (this->m_constraints).m_data;
              if ((ptr_01 != (btTypedConstraint **)0x0) &&
                 ((this->m_constraints).m_ownsMemory == true)) {
                btAlignedFreeInternal(ptr_01);
                uVar2 = (this->m_constraints).m_size;
              }
              (this->m_constraints).m_ownsMemory = true;
              (this->m_constraints).m_data = ppbVar5;
              (this->m_constraints).m_capacity = uVar9;
              uVar6 = uVar2;
              uVar2 = uVar9;
            }
          }
          (this->m_constraints).m_data[(int)uVar6] = ppbVar13[uVar10];
          uVar6 = uVar6 + 1;
          (this->m_constraints).m_size = uVar6;
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar8);
      }
      if ((int)(uVar6 + (this->m_manifolds).m_size) <=
          (this->m_solverInfo->super_btContactSolverInfoData).m_minimumSolverBatchSize) {
        return;
      }
      processConstraints(this);
      return;
    }
    pp_Var11 = this->m_solver->_vptr_btConstraintSolver;
  }
  (*pp_Var11[3])();
  return;
}

Assistant:

virtual	void	processIsland(btCollisionObject** bodies,int numBodies,btPersistentManifold**	manifolds,int numManifolds, int islandId)
	{
		if (islandId<0)
		{
			///we don't split islands, so all constraints/contact manifolds/bodies are passed into the solver regardless the island id
			m_solver->solveGroup( bodies,numBodies,manifolds, numManifolds,&m_sortedConstraints[0],m_numConstraints,*m_solverInfo,m_debugDrawer,m_dispatcher);
		} else
		{
				//also add all non-contact constraints/joints for this island
			btTypedConstraint** startConstraint = 0;
			int numCurConstraints = 0;
			int i;

			//find the first constraint for this island
			for (i=0;i<m_numConstraints;i++)
			{
				if (btGetConstraintIslandId(m_sortedConstraints[i]) == islandId)
				{
					startConstraint = &m_sortedConstraints[i];
					break;
				}
			}
			//count the number of constraints in this island
			for (;i<m_numConstraints;i++)
			{
				if (btGetConstraintIslandId(m_sortedConstraints[i]) == islandId)
				{
					numCurConstraints++;
				}
			}

			if (m_solverInfo->m_minimumSolverBatchSize<=1)
			{
				m_solver->solveGroup( bodies,numBodies,manifolds, numManifolds,startConstraint,numCurConstraints,*m_solverInfo,m_debugDrawer,m_dispatcher);
			} else
			{

				for (i=0;i<numBodies;i++)
					m_bodies.push_back(bodies[i]);
				for (i=0;i<numManifolds;i++)
					m_manifolds.push_back(manifolds[i]);
				for (i=0;i<numCurConstraints;i++)
					m_constraints.push_back(startConstraint[i]);
				if ((m_constraints.size()+m_manifolds.size())>m_solverInfo->m_minimumSolverBatchSize)
				{
					processConstraints();
				} else
				{
					//printf("deferred\n");
				}
			}
		}
	}